

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_barrier_(lua_State *L,GCObject *o,GCObject *v)

{
  global_State *g_00;
  global_State *g;
  GCObject *v_local;
  GCObject *o_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (((((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) &&
      ((v->marked & (g_00->currentwhite ^ 0x18)) == 0)) &&
     ((o->marked & (g_00->currentwhite ^ 0x18)) == 0)) {
    if (g_00->gcstate < 3) {
      reallymarkobject(g_00,v);
      if (1 < (o->marked & 7)) {
        if (1 < (v->marked & 7)) {
          __assert_fail("!(((v)->marked & 7) > 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x119,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
        }
        v->marked = v->marked & 0xf8 | 2;
      }
    }
    else {
      if ((g_00->gcstate < 3) || (6 < g_00->gcstate)) {
        __assert_fail("(3 <= (g)->gcstate && (g)->gcstate <= 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x11e,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
      }
      if (g_00->gckind == '\0') {
        o->marked = o->marked & 199 | g_00->currentwhite & 0x18;
      }
    }
    return;
  }
  __assert_fail("(((o)->marked) & ((1<<(5)))) && (((v)->marked) & (((1<<(3)) | (1<<(4))))) && !(((v)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4)))))) && !(((o)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x115,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
}

Assistant:

void luaC_barrier_ (lua_State *L, GCObject *o, GCObject *v) {
  global_State *g = G(L);
  lua_assert(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o));
  if (keepinvariant(g)) {  /* must keep invariant? */
    reallymarkobject(g, v);  /* restore invariant */
    if (isold(o)) {
      lua_assert(!isold(v));  /* white object could not be old */
      setage(v, G_OLD0);  /* restore generational invariant */
    }
  }
  else {  /* sweep phase */
    lua_assert(issweepphase(g));
    if (g->gckind == KGC_INC)  /* incremental mode? */
      makewhite(g, o);  /* mark 'o' as white to avoid other barriers */
  }
}